

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

void asmjit::v1_14::EmitterUtils::logInstructionEmitted
               (BaseAssembler *self,InstId instId,InstOptions options,Operand_ *o0,Operand_ *o1,
               Operand_ *o2,Operand_ *opExt,uint32_t relSize,uint32_t immSize,uint8_t *afterCursor)

{
  FormatFlags FVar1;
  Logger *pLVar2;
  char *pcVar3;
  size_t binSize;
  uint8_t *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  size_t offsetSize;
  size_t immSize_00;
  BaseInst aBStack_3d0 [4];
  undefined4 uStack_3cc;
  RegOnly RStack_3c8;
  undefined8 uStack_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  char *pcStack_3a8;
  char acStack_3a0 [272];
  Operand_ OStack_290;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  Logger *pLStack_228;
  undefined4 uStack_1f0;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  InstId local_1d8;
  InstOptions local_1d4;
  RegOnly local_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [272];
  Operand_ local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pLVar2 = (self->super_BaseEmitter)._logger;
  if (pLVar2 == (Logger *)0x0) {
    logInstructionEmitted();
    pcStack_3a8 = acStack_3a0;
    uStack_3b8 = 0;
    uStack_3c0 = 0x20;
    uStack_3b0 = 0x107;
    acStack_3a0[0] = '\0';
    pLStack_228 = pLVar2;
    pcVar3 = DebugUtils::errorAsString(instId);
    String::_opString((String *)&uStack_3c0,kAppend,pcVar3,0xffffffffffffffff);
    String::_opString((String *)&uStack_3c0,kAppend,": ",0xffffffffffffffff);
    OStack_290._signature._bits = (o1->_signature)._bits;
    OStack_290._baseId = o1->_baseId;
    OStack_290._data = *&o1->_data;
    uStack_280._0_4_ = o2->_signature;
    uStack_280._4_4_ = o2->_baseId;
    uStack_278 = *(undefined8 *)o2->_data;
    uStack_270 = *(undefined8 *)CONCAT44(local_1ec,uStack_1f0);
    uStack_268 = ((undefined8 *)CONCAT44(local_1ec,uStack_1f0))[1];
    uStack_260 = *local_1e8;
    uStack_258 = local_1e8[1];
    uStack_250 = local_1e8[2];
    uStack_248 = local_1e8[3];
    uStack_240 = local_1e8[4];
    uStack_238 = local_1e8[5];
    RStack_3c8 = (self->super_BaseEmitter)._extraReg;
    uStack_3cc = (int)o0;
    (*(self->super_BaseEmitter)._funcs.formatInstruction)
              ((String *)&uStack_3c0,kRegType,&self->super_BaseEmitter,
               (self->super_BaseEmitter)._environment._arch,aBStack_3d0,&OStack_290,6);
    if ((self->super_BaseEmitter)._inlineComment != (char *)0x0) {
      String::_opString((String *)&uStack_3c0,kAppend," ; ",0xffffffffffffffff);
      String::_opString((String *)&uStack_3c0,kAppend,(self->super_BaseEmitter)._inlineComment,
                        0xffffffffffffffff);
    }
    (self->super_BaseEmitter)._instOptions = kNone;
    (self->super_BaseEmitter)._extraReg._signature = 0;
    *(undefined8 *)&(self->super_BaseEmitter)._extraReg._id = 0;
    *(undefined4 *)((long)&(self->super_BaseEmitter)._inlineComment + 4) = 0;
    pcVar3 = pcStack_3a8;
    if ((byte)uStack_3c0._0_1_ < 0x1f) {
      pcVar3 = (char *)((long)&uStack_3c0 + 1);
    }
    BaseEmitter::reportError(&self->super_BaseEmitter,instId,pcVar3);
    String::reset((String *)&uStack_3c0);
    return;
  }
  local_1b0 = local_1a8;
  uStack_1c0 = 0;
  local_1c8 = 0x20;
  local_1b8 = 0x107;
  local_1a8[0] = 0;
  FVar1 = (pLVar2->_options)._flags;
  puVar4 = self->_bufferPtr;
  local_98._signature._bits = (o0->_signature)._bits;
  local_98._baseId = o0->_baseId;
  local_98._data = *&o0->_data;
  local_88._0_4_ = o1->_signature;
  local_88._4_4_ = o1->_baseId;
  uStack_80 = *(undefined8 *)o1->_data;
  local_78._0_4_ = o2->_signature;
  local_78._4_4_ = o2->_baseId;
  uStack_70 = *(undefined8 *)o2->_data;
  local_68._0_4_ = opExt->_signature;
  local_68._4_4_ = opExt->_baseId;
  uStack_60 = *(undefined8 *)opExt->_data;
  local_58._0_4_ = opExt[1]._signature;
  local_58._4_4_ = opExt[1]._baseId;
  uStack_50 = *(undefined8 *)opExt[1]._data;
  local_48._0_4_ = opExt[2]._signature;
  local_48._4_4_ = opExt[2]._baseId;
  uStack_40 = *(undefined8 *)opExt[2]._data;
  String::_opChars((String *)&local_1c8,kAppend,' ',(ulong)(pLVar2->_options)._indentation._data[0])
  ;
  local_1d0 = (self->super_BaseEmitter)._extraReg;
  local_1d8 = instId;
  local_1d4 = options;
  (*(self->super_BaseEmitter)._funcs.formatInstruction)
            ((String *)&local_1c8,FVar1,&self->super_BaseEmitter,
             (self->super_BaseEmitter)._environment._arch,(BaseInst *)&local_1d8,&local_98,6);
  if ((FVar1 & kMachineCode) == kNone) {
    pcVar3 = (self->super_BaseEmitter)._inlineComment;
    puVar4 = (uint8_t *)0x0;
    binSize = 0xffffffffffffffff;
    offsetSize = 0;
    immSize_00 = 0;
  }
  else {
    binSize = (long)afterCursor - (long)puVar4;
    pcVar3 = (self->super_BaseEmitter)._inlineComment;
    puVar4 = self->_bufferPtr;
    offsetSize = (size_t)relSize;
    immSize_00 = (size_t)immSize;
  }
  finishFormattedLine((String *)&local_1c8,&pLVar2->_options,puVar4,binSize,offsetSize,immSize_00,
                      pcVar3);
  uVar5 = uStack_1c0;
  puVar6 = local_1b0;
  if ((local_1c8 & 0xff) < 0x1f) {
    uVar5 = local_1c8 & 0xff;
    puVar6 = (undefined1 *)((long)&local_1c8 + 1);
  }
  (*pLVar2->_vptr_Logger[2])(pLVar2,puVar6,uVar5);
  String::reset((String *)&local_1c8);
  return;
}

Assistant:

void logInstructionEmitted(
  BaseAssembler* self,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt,
  uint32_t relSize, uint32_t immSize, uint8_t* afterCursor) {

  Logger* logger = self->logger();
  ASMJIT_ASSERT(logger != nullptr);

  StringTmp<256> sb;
  FormatFlags formatFlags = logger->flags();

  uint8_t* beforeCursor = self->bufferPtr();
  intptr_t emittedSize = (intptr_t)(afterCursor - beforeCursor);

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kCode));
  self->_funcs.formatInstruction(sb, formatFlags, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (Support::test(formatFlags, FormatFlags::kMachineCode))
    finishFormattedLine(sb, logger->options(), self->bufferPtr(), size_t(emittedSize), relSize, immSize, self->inlineComment());
  else
    finishFormattedLine(sb, logger->options(), nullptr, SIZE_MAX, 0, 0, self->inlineComment());
  logger->log(sb);
}